

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_bddPickOneMinterm(DdManager *dd,DdNode *f,DdNode **vars,int n)

{
  int iVar1;
  char *string_00;
  void *__ptr;
  ulong uVar2;
  DdNode *pDVar3;
  DdNode *neW;
  DdNode *old;
  int result;
  int *indices;
  int size;
  int i;
  char *string;
  int n_local;
  DdNode **vars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  string_00 = (char *)malloc((long)dd->size);
  if (string_00 == (char *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    __ptr = malloc((long)n << 2);
    if (__ptr == (void *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      if (string_00 != (char *)0x0) {
        free(string_00);
      }
      dd_local = (DdManager *)0x0;
    }
    else {
      for (indices._4_4_ = 0; indices._4_4_ < n; indices._4_4_ = indices._4_4_ + 1) {
        *(DdHalfWord *)((long)__ptr + (long)indices._4_4_ * 4) = vars[indices._4_4_]->index;
      }
      iVar1 = Cudd_bddPickOneCube(dd,f,string_00);
      if (iVar1 == 0) {
        if (string_00 != (char *)0x0) {
          free(string_00);
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        dd_local = (DdManager *)0x0;
      }
      else {
        for (indices._4_4_ = 0; indices._4_4_ < n; indices._4_4_ = indices._4_4_ + 1) {
          if (string_00[*(int *)((long)__ptr + (long)indices._4_4_ * 4)] == '\x02') {
            uVar2 = Cudd_Random();
            string_00[*(int *)((long)__ptr + (long)indices._4_4_ * 4)] =
                 (char)((long)(uVar2 & 0x20) >> 5);
          }
        }
        neW = Cudd_ReadOne(dd);
        *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) + 1;
        for (indices._4_4_ = n + -1; -1 < indices._4_4_; indices._4_4_ = indices._4_4_ + -1) {
          pDVar3 = Cudd_bddAnd(dd,neW,(DdNode *)
                                      ((ulong)vars[indices._4_4_] ^
                                      (long)(int)(uint)(string_00[*(int *)((long)__ptr +
                                                                          (long)indices._4_4_ * 4)]
                                                       == '\0')));
          if (pDVar3 == (DdNode *)0x0) {
            if (string_00 != (char *)0x0) {
              free(string_00);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            Cudd_RecursiveDeref(dd,neW);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,neW);
          neW = pDVar3;
        }
        *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) + -1;
        if (string_00 != (char *)0x0) {
          free(string_00);
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        dd_local = (DdManager *)neW;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddPickOneMinterm(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick one minterm */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */)
{
    char *string;
    int i, size;
    int *indices;
    int result;
    DdNode *old, *neW;

    size = dd->size;
    string = ABC_ALLOC(char, size);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = Cudd_bddPickOneCube(dd,f,string);
    if (result == 0) {
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    /* Randomize choice for don't cares. */
    for (i = 0; i < n; i++) {
        if (string[indices[i]] == 2)
            string[indices[i]] = (char) ((Cudd_Random() & 0x20) >> 5);
    }

    /* Build result BDD. */
    old = Cudd_ReadOne(dd);
    cuddRef(old);

    for (i = n-1; i >= 0; i--) {
        neW = Cudd_bddAnd(dd,old,Cudd_NotCond(vars[i],string[indices[i]]==0));
        if (neW == NULL) {
            ABC_FREE(string);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,old);
            return(NULL);
        }
        cuddRef(neW);
        Cudd_RecursiveDeref(dd,old);
        old = neW;
    }

#ifdef DD_DEBUG
    /* Test. */
    if (Cudd_bddLeq(dd,old,f)) {
        cuddDeref(old);
    } else {
        Cudd_RecursiveDeref(dd,old);
        old = NULL;
    }
#else
    cuddDeref(old);
#endif

    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}